

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QList<QTzTransition> *
parseTzTransitions(QList<QTzTransition> *__return_storage_ptr__,QDataStream *ds,int tzh_timecnt,
                  bool longTran)

{
  quint8 qVar1;
  Status SVar2;
  pointer pQVar3;
  undefined3 in_register_00000009;
  ulong size;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  quint8 typeind;
  qint32 val;
  quint8 local_3d;
  qint32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTzTransition>::QList(__return_storage_ptr__,(long)tzh_timecnt);
  if (CONCAT31(in_register_00000009,longTran) == 0) {
    local_3c = -0x55555556;
    lVar6 = 0;
    if (tzh_timecnt < 1) {
      tzh_timecnt = 0;
    }
    uVar7 = (ulong)(uint)tzh_timecnt;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      SVar2 = QDataStream::status(ds);
      if (SVar2 != Ok) break;
      QDataStream::operator>>(ds,&local_3c);
      lVar4 = (long)local_3c;
      pQVar3 = QList<QTzTransition>::data(__return_storage_ptr__);
      *(long *)((long)&pQVar3->tz_time + lVar6) = lVar4;
      SVar2 = QDataStream::status(ds);
      if (SVar2 != Ok) {
        QList<QTzTransition>::resize(__return_storage_ptr__,uVar5);
      }
      lVar6 = lVar6 + 0x10;
    }
  }
  else {
    uVar5 = 0;
    uVar7 = (ulong)(uint)tzh_timecnt;
    if (tzh_timecnt < 1) {
      uVar7 = uVar5;
    }
    for (size = 0; uVar7 != size; size = size + 1) {
      SVar2 = QDataStream::status(ds);
      if (SVar2 != Ok) break;
      pQVar3 = QList<QTzTransition>::data(__return_storage_ptr__);
      QDataStream::operator>>(ds,(qint64 *)((long)&pQVar3->tz_time + uVar5));
      SVar2 = QDataStream::status(ds);
      if (SVar2 != Ok) {
        QList<QTzTransition>::resize(__return_storage_ptr__,size);
      }
      uVar5 = uVar5 + 0x10;
    }
  }
  for (lVar6 = 0; uVar7 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
    SVar2 = QDataStream::status(ds);
    if (SVar2 != Ok) break;
    local_3d = 0xaa;
    QDataStream::operator>>(ds,(qint8 *)&local_3d);
    SVar2 = QDataStream::status(ds);
    qVar1 = local_3d;
    if (SVar2 == Ok) {
      pQVar3 = QList<QTzTransition>::data(__return_storage_ptr__);
      (&pQVar3->tz_typeind)[lVar6] = qVar1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QList<QTzTransition> parseTzTransitions(QDataStream &ds, int tzh_timecnt, bool longTran)
{
    QList<QTzTransition> transitions(tzh_timecnt);

    if (longTran) {
        // Parse tzh_timecnt x 8-byte transition times
        for (int i = 0; i < tzh_timecnt && ds.status() == QDataStream::Ok; ++i) {
            ds >> transitions[i].tz_time;
            if (ds.status() != QDataStream::Ok)
                transitions.resize(i);
        }
    } else {
        // Parse tzh_timecnt x 4-byte transition times
        qint32 val;
        for (int i = 0; i < tzh_timecnt && ds.status() == QDataStream::Ok; ++i) {
            ds >> val;
            transitions[i].tz_time = val;
            if (ds.status() != QDataStream::Ok)
                transitions.resize(i);
        }
    }

    // Parse tzh_timecnt x 1-byte transition type index
    for (int i = 0; i < tzh_timecnt && ds.status() == QDataStream::Ok; ++i) {
        quint8 typeind;
        ds >> typeind;
        if (ds.status() == QDataStream::Ok)
            transitions[i].tz_typeind = typeind;
    }

    return transitions;
}